

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O3

uint16_t __thiscall AmstradCPC::KeyboardMapper::mapped_key_for_key(KeyboardMapper *this,Key key)

{
  uint16_t uVar1;
  
  uVar1 = 0xfffe;
  if (key < Help) {
    uVar1 = *(uint16_t *)(&DAT_004ab9f0 + (ulong)key * 2);
  }
  return uVar1;
}

Assistant:

uint16_t KeyboardMapper::mapped_key_for_key(Inputs::Keyboard::Key key) const {
#define BIND(source, dest)	case Inputs::Keyboard::Key::source:	return dest
	switch(key) {
		default: break;

		BIND(BackTick, KeyCopy);

		BIND(k0, Key0);		BIND(k1, Key1);		BIND(k2, Key2);		BIND(k3, Key3);		BIND(k4, Key4);
		BIND(k5, Key5);		BIND(k6, Key6);		BIND(k7, Key7);		BIND(k8, Key8);		BIND(k9, Key9);
		BIND(Q, KeyQ);		BIND(W, KeyW);		BIND(E, KeyE);		BIND(R, KeyR);		BIND(T, KeyT);
		BIND(Y, KeyY);		BIND(U, KeyU);		BIND(I, KeyI);		BIND(O, KeyO);		BIND(P, KeyP);
		BIND(A, KeyA);		BIND(S, KeyS);		BIND(D, KeyD);		BIND(F, KeyF);		BIND(G, KeyG);
		BIND(H, KeyH);		BIND(J, KeyJ);		BIND(K, KeyK);		BIND(L, KeyL);
		BIND(Z, KeyZ);		BIND(X, KeyX);		BIND(C, KeyC);		BIND(V, KeyV);
		BIND(B, KeyB);		BIND(N, KeyN);		BIND(M, KeyM);

		BIND(Escape, KeyEscape);
		BIND(F1, KeyF1);	BIND(F2, KeyF2);	BIND(F3, KeyF3);	BIND(F4, KeyF4);	BIND(F5, KeyF5);
		BIND(F6, KeyF6);	BIND(F7, KeyF7);	BIND(F8, KeyF8);	BIND(F9, KeyF9);	BIND(F10, KeyF0);

		BIND(F11, KeyRightSquareBracket);
		BIND(F12, KeyClear);

		BIND(Hyphen, KeyMinus);		BIND(Equals, KeyCaret);		BIND(Backspace, KeyDelete);
		BIND(Tab, KeyTab);

		BIND(OpenSquareBracket, KeyAt);
		BIND(CloseSquareBracket, KeyLeftSquareBracket);
		BIND(Backslash, KeyBackSlash);

		BIND(CapsLock, KeyCapsLock);
		BIND(Semicolon, KeyColon);
		BIND(Quote, KeySemicolon);
		BIND(Hash, KeyRightSquareBracket);
		BIND(Enter, KeyReturn);

		BIND(LeftShift, KeyShift);
		BIND(Comma, KeyComma);
		BIND(FullStop, KeyFullStop);
		BIND(ForwardSlash, KeyForwardSlash);
		BIND(RightShift, KeyShift);

		BIND(LeftControl, KeyControl);	BIND(LeftOption, KeyControl);	BIND(LeftMeta, KeyControl);
		BIND(Space, KeySpace);
		BIND(RightMeta, KeyControl);	BIND(RightOption, KeyControl);	BIND(RightControl, KeyControl);

		BIND(Left, KeyLeft);	BIND(Right, KeyRight);
		BIND(Up, KeyUp);		BIND(Down, KeyDown);

		BIND(Keypad0, KeyF0);
		BIND(Keypad1, KeyF1);		BIND(Keypad2, KeyF2);		BIND(Keypad3, KeyF3);
		BIND(Keypad4, KeyF4);		BIND(Keypad5, KeyF5);		BIND(Keypad6, KeyF6);
		BIND(Keypad7, KeyF7);		BIND(Keypad8, KeyF8);		BIND(Keypad9, KeyF9);
		BIND(KeypadPlus, KeySemicolon);
		BIND(KeypadMinus, KeyMinus);

		BIND(KeypadEnter, KeyEnter);
		BIND(KeypadDecimalPoint, KeyFullStop);
		BIND(KeypadEquals, KeyMinus);
		BIND(KeypadSlash, KeyForwardSlash);
		BIND(KeypadAsterisk, KeyColon);
		BIND(KeypadDelete, KeyDelete);
	}
#undef BIND
	return MachineTypes::MappedKeyboardMachine::KeyNotMapped;
}